

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacketbuilder.h
# Opt level: O1

size_t __thiscall jrtplib::RTCPCompoundPacketBuilder::SDES::NeededBytes(SDES *this)

{
  long lVar1;
  _Self __tmp;
  _List_node_base *p_Var2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  
  p_Var2 = (this->sdessources).
           super__List_base<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var2 != (_List_node_base *)&this->sdessources) {
    lVar4 = 0;
    do {
      lVar3 = (long)p_Var2[1]._M_next[3]._M_next;
      lVar1 = lVar3 + 1;
      uVar5 = (ulong)((uint)lVar1 & 3);
      lVar3 = (lVar3 - uVar5) + 5;
      if (uVar5 == 0) {
        lVar3 = lVar1;
      }
      p_Var2 = p_Var2->_M_next;
      lVar4 = lVar4 + lVar3 + 4;
    } while (p_Var2 != (_List_node_base *)&this->sdessources);
    uVar5 = (this->sdessources).
            super__List_base<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>_>
            ._M_impl._M_node._M_size;
    return lVar4 + ((ulong)(0x842108421084210 < uVar5 * -0x1084210842108421) + uVar5 / 0x1f) * 4;
  }
  return 0;
}

Assistant:

size_t NeededBytes()
		{
			std::list<SDESSource *>::const_iterator it;
			size_t x = 0;
			size_t n,d,r;
			
			if (sdessources.empty())
				return 0;
			
			for (it = sdessources.begin() ; it != sdessources.end() ; it++)
				x += (*it)->NeededBytes();
			n = sdessources.size();
			d = n/31;
			r = n%31;
			if (r != 0)
				d++;
			x += d*sizeof(RTCPCommonHeader);
			return x;
		}